

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

StringResult<QByteArray> * __thiscall
QCborStreamReader::_readUtf8String_helper(QCborStreamReader *this)

{
  long lVar1;
  ReadStringChunk params;
  Code CVar2;
  pointer this_00;
  QCborStreamReader *this_01;
  StringResult<QByteArray> *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  StringResult<long_long> SVar4;
  StringResult<QByteArray> *result;
  StringResult<long_long> r;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  Code local_3c;
  QCborStreamReader *local_38;
  StringResultCode local_30;
  anon_union_8_3_4d1d901a_for_ReadStringChunk_0 in_stack_ffffffffffffffe0;
  undefined1 *puVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->data).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->status = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->data).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->data).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  StringResult<QByteArray>::StringResult
            ((StringResult<QByteArray> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  puVar5 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = std::
            unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
            operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                        *)0x8d7619);
  QCborStreamReaderPrivate::ReadStringChunk::ReadStringChunk
            ((ReadStringChunk *)&stack0xffffffffffffffd8,&in_RDI->data,Utf8String);
  params.maxlen_or_type = (qsizetype)puVar5;
  params.field_0.ptr = in_stack_ffffffffffffffe0.ptr;
  SVar4 = QCborStreamReaderPrivate::readStringChunk(this_00,params);
  this_01 = (QCborStreamReader *)SVar4.data;
  local_30 = SVar4.status;
  in_RDI->status = local_30;
  local_38 = this_01;
  if (local_30 == Error) {
    QByteArray::clear((QByteArray *)0x8d76a9);
  }
  else {
    bVar3 = false;
    if (local_30 == EndOfString) {
      local_3c = (Code)lastError((QCborStreamReader *)
                                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      CVar2 = QCborError::operator_cast_to_Code((QCborError *)&local_3c);
      bVar3 = CVar2 == NoError;
    }
    if (bVar3) {
      preparse(this_01);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QCborStreamReader::StringResult<QByteArray> QCborStreamReader::_readUtf8String_helper()
{
    using P = QCborStreamReaderPrivate::ReadStringChunk;
    QCborStreamReader::StringResult<QByteArray> result;
    auto r = d->readStringChunk(P{ &result.data, P::Utf8String });
    result.status = r.status;
    if (r.status == Error) {
        result.data.clear();
    } else {
        Q_ASSERT(r.data == result.data.size());
        if (r.status == EndOfString && lastError() == QCborError::NoError)
            preparse();
    }

    return result;
}